

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sstring_view.hpp
# Opt level: O2

bool pstore::operator==(sstring_view<const_char_*> *lhs,char (*rhs) [4])

{
  size_t sVar1;
  int iVar2;
  size_t sVar3;
  bool bVar4;
  
  sVar1 = lhs->size_;
  sVar3 = strlen(*rhs);
  if (sVar1 == sVar3) {
    iVar2 = sstring_view<const_char_*>::compare<char[4]>(lhs,rhs);
    bVar4 = iVar2 == 0;
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

inline bool operator== (sstring_view<PointerType> const & lhs,
                            StringType const & rhs) noexcept {
        if (string_traits<sstring_view<PointerType>>::length (lhs) !=
            string_traits<StringType>::length (rhs)) {
            return false;
        }
        return lhs.compare (rhs) == 0;
    }